

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O3

int pztopology::TPZTetrahedron::ContainedSideLocId(int side,int node)

{
  ostream *poVar1;
  
  if (0xf < (uint)side) {
    return -1;
  }
  if ((uint)side < 4) {
    if (node == 0) {
      return side;
    }
  }
  else if ((uint)side < 7) {
    if (node == 2) {
      return side;
    }
    if (node == 1) {
      if (2 < side - 3U) {
        return side + -6;
      }
      return side - 3U;
    }
    if (node == 0) {
      return side + -4;
    }
  }
  else if ((uint)side < 10) {
    if (node == 2) {
      return side;
    }
    if (node == 1) {
      return 3;
    }
    if (node == 0) {
      return side + -7;
    }
  }
  else if ((uint)side < 0xe) {
    if (node < 7) {
      return *(int *)(FaceConnectLocId + (long)node * 4 + (ulong)(side - 10) * 0x1c);
    }
  }
  else if (side == 0xe && node < 0xf) {
    return node;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZShapeTetra::ContainedSideLocId called for node = ",0x34);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,node);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and side = ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return -1;
}

Assistant:

int TPZTetrahedron::ContainedSideLocId(int side, int node) {
		if(side<0 || side>15) return -1;
		if(side<4) {
			if(node==0) return side;
		} else
			if(side<7) {//4,5,6
				int s = side-4;//0,1,2
				if(!node) return s;//0,1,2
				if(node==1) return (s+1)%3;//1,2,0
				if(node==2) return side;//4,5,6
			} else
				if(side<10) {//7,8,9
					int s = side-7;//0,1,2
					if(!node) return s;//0,1,2
					if(node==1) return 3;//4,4,4
					if(node==2) return side;//7,8,9
				} else
					if(side<14) {//10 a 13
						int s = side-10;
						if(node<7) return FaceConnectLocId[s][node];
					} else
						if(side==14 && node<15){
							return node;
						}
		PZError << "TPZShapeTetra::ContainedSideLocId called for node = "
		<< node << " and side = " << side << "\n";
		return -1;
	}